

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fInstancedRenderingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::InstancedRenderingCase::setupAndRender(InstancedRenderingCase *this)

{
  deUint32 program_00;
  GLuint GVar1;
  GLint GVar2;
  reference pvVar3;
  reference pvVar4;
  size_type sVar5;
  reference indices;
  int numPositionComponents;
  int bLoc;
  int gLoc;
  int rLoc;
  int offsetLoc;
  int positionLoc;
  deUint32 program;
  InstancedRenderingCase *this_local;
  
  program_00 = glu::ShaderProgram::getProgram(this->m_program);
  glwUseProgram(program_00);
  GVar1 = glwGetAttribLocation(program_00,"a_position");
  glwEnableVertexAttribArray(GVar1);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&this->m_gridVertexPositions,0);
  glwVertexAttribPointer(GVar1,2,0x1406,'\0',0,pvVar3);
  if ((this->m_instancingType == TYPE_ATTRIB_DIVISOR) || (this->m_instancingType == TYPE_MIXED)) {
    if (this->m_instancingType == TYPE_ATTRIB_DIVISOR) {
      GVar1 = glwGetAttribLocation(program_00,"a_instanceOffset");
      glwEnableVertexAttribArray(GVar1);
      glwVertexAttribDivisor(GVar1,1);
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&this->m_instanceOffsets,0);
      glwVertexAttribPointer(GVar1,3,0x1406,'\0',0,pvVar3);
      GVar2 = glwGetAttribLocation(program_00,"a_instanceR");
      pvVar4 = std::
               vector<deqp::gles3::Functional::vcns::VarComp,_std::allocator<deqp::gles3::Functional::vcns::VarComp>_>
               ::operator[](&this->m_instanceColorR,0);
      setupVarAttribPointer(this,pvVar4,GVar2,3);
    }
    GVar2 = glwGetAttribLocation(program_00,"a_instanceG");
    pvVar4 = std::
             vector<deqp::gles3::Functional::vcns::VarComp,_std::allocator<deqp::gles3::Functional::vcns::VarComp>_>
             ::operator[](&this->m_instanceColorG,0);
    setupVarAttribPointer(this,pvVar4,GVar2,2);
    GVar2 = glwGetAttribLocation(program_00,"a_instanceB");
    pvVar4 = std::
             vector<deqp::gles3::Functional::vcns::VarComp,_std::allocator<deqp::gles3::Functional::vcns::VarComp>_>
             ::operator[](&this->m_instanceColorB,0);
    setupVarAttribPointer(this,pvVar4,GVar2,1);
  }
  if (this->m_function == FUNCTION_DRAW_ARRAYS_INSTANCED) {
    sVar5 = std::vector<float,_std::allocator<float>_>::size(&this->m_gridVertexPositions);
    glwDrawArraysInstanced
              (4,0,(GLsizei)((long)((ulong)(uint)((int)sVar5 >> 0x1f) << 0x20 | sVar5 & 0xffffffff)
                            / 2),this->m_numInstances);
  }
  else {
    sVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->m_gridIndices)
    ;
    indices = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                        (&this->m_gridIndices,0);
    glwDrawElementsInstanced(4,(GLsizei)sVar5,0x1403,indices,this->m_numInstances);
  }
  glwUseProgram(0);
  return;
}

Assistant:

void InstancedRenderingCase::setupAndRender (void)
{
	deUint32 program = m_program->getProgram();

	glUseProgram(program);

	{
		// Setup attributes.

		// Position attribute is non-instanced.
		int positionLoc = glGetAttribLocation(program, "a_position");
		glEnableVertexAttribArray(positionLoc);
		glVertexAttribPointer(positionLoc, 2, GL_FLOAT, GL_FALSE, 0, &m_gridVertexPositions[0]);

		if (m_instancingType == TYPE_ATTRIB_DIVISOR || m_instancingType == TYPE_MIXED)
		{
			if (m_instancingType == TYPE_ATTRIB_DIVISOR)
			{
				// Position offset attribute is instanced with separate offset for every instance.
				int offsetLoc = glGetAttribLocation(program, "a_instanceOffset");
				glEnableVertexAttribArray(offsetLoc);
				glVertexAttribDivisor(offsetLoc, 1);
				glVertexAttribPointer(offsetLoc, OFFSET_COMPONENTS, GL_FLOAT, GL_FALSE, 0, &m_instanceOffsets[0]);

				int rLoc = glGetAttribLocation(program, "a_instanceR");
				setupVarAttribPointer((void*)&m_instanceColorR[0].u32, rLoc, ATTRIB_DIVISOR_R);
			}

			int gLoc = glGetAttribLocation(program, "a_instanceG");
			setupVarAttribPointer((void*)&m_instanceColorG[0].u32, gLoc, ATTRIB_DIVISOR_G);

			int bLoc = glGetAttribLocation(program, "a_instanceB");
			setupVarAttribPointer((void*)&m_instanceColorB[0].u32, bLoc, ATTRIB_DIVISOR_B);
		}
	}

	// Draw using appropriate function.

	if (m_function == FUNCTION_DRAW_ARRAYS_INSTANCED)
	{
		const int numPositionComponents = 2;
		glDrawArraysInstanced(GL_TRIANGLES, 0, ((int)m_gridVertexPositions.size() / numPositionComponents), m_numInstances);
	}
	else
		glDrawElementsInstanced(GL_TRIANGLES, (int)m_gridIndices.size(), GL_UNSIGNED_SHORT, &m_gridIndices[0], m_numInstances);

	glUseProgram(0);
}